

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFront.cpp
# Opt level: O2

void __thiscall TPZFront<float>::~TPZFront(TPZFront<float> *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

TPZFront<TVar>::~TPZFront(){
}